

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_sort_tree.hpp
# Opt level: O0

void __thiscall
duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>::BuildRun
          (MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL> *this,
          idx_t level_idx,idx_t run_idx)

{
  unsigned_long uVar1;
  bool bVar2;
  reference pvVar3;
  reference pvVar4;
  const_reference pvVar5;
  reference pvVar6;
  long in_RDX;
  ulong in_RSI;
  Games *in_RDI;
  idx_t i_1;
  idx_t j;
  unsigned_long *child_idx_1;
  unsigned_long child_run_1;
  idx_t i;
  RunElement winner;
  unsigned_long cascade_idx;
  unsigned_long element_idx;
  Games games;
  unsigned_long child_idx;
  idx_t child_run;
  unsigned_long child_base;
  RunElements players;
  array<std::pair<unsigned_long,_unsigned_long>,_32UL> bounds;
  RunElement SENTINEL;
  idx_t l;
  unsigned_long run_length;
  idx_t child_run_length;
  size_type count;
  value_type *child_level;
  vector<unsigned_long,_true> *cascades;
  vector<unsigned_long,_true> *elements;
  unsigned_long cascading;
  unsigned_long fanout;
  pair<unsigned_long,_unsigned_long> *in_stack_fffffffffffff898;
  pair<unsigned_long,_unsigned_long> *in_stack_fffffffffffff8a0;
  array<std::pair<unsigned_long,_unsigned_long>,_32UL> *in_stack_fffffffffffff8b0;
  RunElement *in_stack_fffffffffffff8b8;
  unsigned_long in_stack_fffffffffffff8c0;
  MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>
  *in_stack_fffffffffffff8d0;
  ulong uVar7;
  ulong local_728;
  RunElement local_720;
  pair<unsigned_long,_unsigned_long> local_710;
  RunElement local_700;
  reference local_6f0;
  pair<unsigned_long,_unsigned_long> *local_6e8;
  ulong local_6e0;
  RunElement local_6d8;
  long local_6c8;
  ulong local_6c0;
  RunElement *in_stack_fffffffffffffb20;
  RunElements *in_stack_fffffffffffffb28;
  Games *in_stack_fffffffffffffb30;
  MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>
  *in_stack_fffffffffffffb38;
  unsigned_long local_4b8;
  unsigned_long local_4b0;
  pair<unsigned_long,_unsigned_long> local_4a8;
  unsigned_long local_498;
  unsigned_long local_490;
  ulong local_488;
  return_type local_80;
  return_type local_78;
  pair<unsigned_long,_unsigned_long> local_70;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  size_type local_48;
  reference local_40;
  vector<unsigned_long,_true> *local_38;
  reference local_30;
  undefined8 local_28;
  undefined8 local_20;
  long local_18;
  ulong local_10;
  
  local_20 = 0x20;
  local_28 = 0x20;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_30 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
             ::operator[]((vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                           *)in_stack_fffffffffffff8a0,(size_type)in_stack_fffffffffffff898);
  pvVar3 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
           ::operator[]((vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                         *)in_stack_fffffffffffff8a0,(size_type)in_stack_fffffffffffff898);
  local_38 = &pvVar3->second;
  local_40 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
             ::operator[]((vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                           *)in_stack_fffffffffffff8a0,(size_type)in_stack_fffffffffffff898);
  local_48 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_30);
  local_50 = 1;
  local_58 = 0x20;
  for (local_60 = 1; local_60 < local_10; local_60 = local_60 + 1) {
    local_50 = local_58;
    local_58 = local_58 << 5;
  }
  local_78 = MergeSortTraits<unsigned_long>::SENTINEL();
  local_80 = MergeSortTraits<unsigned_long>::SENTINEL();
  ::std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long,_unsigned_long,_true>
            (&local_70,&local_78,&local_80);
  ::std::array<std::pair<unsigned_long,_unsigned_long>,_32UL>::array(in_stack_fffffffffffff8b0);
  ::std::array<std::pair<unsigned_long,_unsigned_long>,_32UL>::array(in_stack_fffffffffffff8b0);
  local_488 = local_18 * local_58;
  for (local_490 = 0; local_490 < 0x20; local_490 = local_490 + 1) {
    local_498 = local_488 + local_490 * local_50;
    local_4b0 = MinValue<unsigned_long>(local_498,local_48);
    local_4b8 = MinValue<unsigned_long>(local_498 + local_50,local_48);
    ::std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long,_unsigned_long,_true>
              (&local_4a8,&local_4b0,&local_4b8);
    pvVar4 = ::std::array<std::pair<unsigned_long,_unsigned_long>,_32UL>::operator[]
                       ((array<std::pair<unsigned_long,_unsigned_long>,_32UL> *)
                        in_stack_fffffffffffff8a0,(size_type)in_stack_fffffffffffff898);
    ::std::pair<unsigned_long,_unsigned_long>::operator=(pvVar4,&local_4a8);
    pvVar4 = ::std::array<std::pair<unsigned_long,_unsigned_long>,_32UL>::operator[]
                       ((array<std::pair<unsigned_long,_unsigned_long>,_32UL> *)
                        in_stack_fffffffffffff8a0,(size_type)in_stack_fffffffffffff898);
    in_stack_fffffffffffff8c0 = pvVar4->first;
    pvVar4 = ::std::array<std::pair<unsigned_long,_unsigned_long>,_32UL>::operator[]
                       ((array<std::pair<unsigned_long,_unsigned_long>,_32UL> *)
                        in_stack_fffffffffffff8a0,(size_type)in_stack_fffffffffffff898);
    if (in_stack_fffffffffffff8c0 == pvVar4->second) {
      pvVar4 = ::std::array<std::pair<unsigned_long,_unsigned_long>,_32UL>::operator[]
                         ((array<std::pair<unsigned_long,_unsigned_long>,_32UL> *)
                          in_stack_fffffffffffff8a0,(size_type)in_stack_fffffffffffff898);
      ::std::pair<unsigned_long,_unsigned_long>::operator=(pvVar4,&local_70);
    }
    else {
      pvVar5 = vector<unsigned_long,_true>::operator[]
                         ((vector<unsigned_long,_true> *)in_stack_fffffffffffff8a0,
                          (size_type)in_stack_fffffffffffff898);
      ::std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long_&,_true>
                ((pair<unsigned_long,_unsigned_long> *)&stack0xfffffffffffffb38,pvVar5,&local_490);
      pvVar4 = ::std::array<std::pair<unsigned_long,_unsigned_long>,_32UL>::operator[]
                         ((array<std::pair<unsigned_long,_unsigned_long>,_32UL> *)
                          in_stack_fffffffffffff8a0,(size_type)in_stack_fffffffffffff898);
      ::std::pair<unsigned_long,_unsigned_long>::operator=(pvVar4,(type)&stack0xfffffffffffffb38);
    }
  }
  ::std::array<std::pair<unsigned_long,_unsigned_long>,_31UL>::array
            ((array<std::pair<unsigned_long,_unsigned_long>,_31UL> *)in_stack_fffffffffffff8b0);
  local_6c0 = local_488;
  local_6c8 = local_18 * 0x20 * ((local_58 >> 5) + 2);
  local_6d8 = StartGames(in_stack_fffffffffffffb38,in_stack_fffffffffffffb30,
                         in_stack_fffffffffffffb28,in_stack_fffffffffffffb20);
  while (bVar2 = ::std::operator!=(in_stack_fffffffffffff8a0,in_stack_fffffffffffff898), bVar2) {
    bVar2 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       in_stack_fffffffffffff8b0);
    if ((!bVar2) && ((local_6c0 & 0x1f) == 0)) {
      for (local_6e0 = 0; local_6e0 < 0x20; local_6e0 = local_6e0 + 1) {
        pvVar4 = ::std::array<std::pair<unsigned_long,_unsigned_long>,_32UL>::operator[]
                           ((array<std::pair<unsigned_long,_unsigned_long>,_32UL> *)
                            in_stack_fffffffffffff8a0,(size_type)in_stack_fffffffffffff898);
        in_stack_fffffffffffff8b8 = (RunElement *)pvVar4->first;
        local_6c8 = local_6c8 + 1;
        pvVar6 = vector<unsigned_long,_true>::operator[]
                           ((vector<unsigned_long,_true> *)in_stack_fffffffffffff8a0,
                            (size_type)in_stack_fffffffffffff898);
        *pvVar6 = (value_type)in_stack_fffffffffffff8b8;
      }
    }
    uVar1 = local_6d8.first;
    local_6c0 = local_6c0 + 1;
    pvVar6 = vector<unsigned_long,_true>::operator[]
                       ((vector<unsigned_long,_true> *)in_stack_fffffffffffff8a0,
                        (size_type)in_stack_fffffffffffff898);
    *pvVar6 = uVar1;
    local_6e8 = (pair<unsigned_long,_unsigned_long> *)local_6d8.second;
    local_6f0 = ::std::array<std::pair<unsigned_long,_unsigned_long>,_32UL>::operator[]
                          ((array<std::pair<unsigned_long,_unsigned_long>,_32UL> *)
                           in_stack_fffffffffffff8a0,(size_type)in_stack_fffffffffffff898);
    local_6f0->first = local_6f0->first + 1;
    in_stack_fffffffffffff8b0 =
         (array<std::pair<unsigned_long,_unsigned_long>,_32UL> *)local_6f0->first;
    pvVar4 = ::std::array<std::pair<unsigned_long,_unsigned_long>,_32UL>::operator[]
                       ((array<std::pair<unsigned_long,_unsigned_long>,_32UL> *)
                        in_stack_fffffffffffff8a0,(size_type)in_stack_fffffffffffff898);
    if (in_stack_fffffffffffff8b0 <
        (array<std::pair<unsigned_long,_unsigned_long>,_32UL> *)pvVar4->second) {
      in_stack_fffffffffffff8a0 = local_6e8;
      pvVar5 = vector<unsigned_long,_true>::operator[]
                         ((vector<unsigned_long,_true> *)local_6e8,
                          (size_type)in_stack_fffffffffffff898);
      ::std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long,_unsigned_long,_true>
                (&local_710,pvVar5,(unsigned_long *)&local_6e8);
      local_700 = ReplayGames(in_stack_fffffffffffff8d0,in_RDI,in_stack_fffffffffffff8c0,
                              in_stack_fffffffffffff8b8);
      ::std::pair<unsigned_long,_unsigned_long>::operator=(&local_6d8,&local_700);
    }
    else {
      local_720 = ReplayGames(in_stack_fffffffffffff8d0,in_RDI,in_stack_fffffffffffff8c0,
                              in_stack_fffffffffffff8b8);
      ::std::pair<unsigned_long,_unsigned_long>::operator=(&local_6d8,&local_720);
    }
  }
  bVar2 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     in_stack_fffffffffffff8b0);
  if (!bVar2) {
    for (local_728 = 0; local_728 < 2; local_728 = local_728 + 1) {
      for (uVar7 = 0; uVar7 < 0x20; uVar7 = uVar7 + 1) {
        pvVar4 = ::std::array<std::pair<unsigned_long,_unsigned_long>,_32UL>::operator[]
                           ((array<std::pair<unsigned_long,_unsigned_long>,_32UL> *)
                            in_stack_fffffffffffff8a0,(size_type)in_stack_fffffffffffff898);
        in_stack_fffffffffffff898 = (pair<unsigned_long,_unsigned_long> *)pvVar4->first;
        local_6c8 = local_6c8 + 1;
        pvVar6 = vector<unsigned_long,_true>::operator[]
                           ((vector<unsigned_long,_true> *)in_stack_fffffffffffff8a0,
                            (size_type)in_stack_fffffffffffff898);
        *pvVar6 = (value_type)in_stack_fffffffffffff898;
      }
    }
  }
  ::std::__atomic_base<unsigned_long>::operator++
            ((__atomic_base<unsigned_long> *)(in_RDI->_M_elems + 5));
  return;
}

Assistant:

void MergeSortTree<E, O, CMP, F, C>::BuildRun(idx_t level_idx, idx_t run_idx) {
	//	Create each parent run by merging the child runs using a tournament tree
	// 	https://en.wikipedia.org/wiki/K-way_merge_algorithm
	const auto fanout = F;
	const auto cascading = C;

	auto &elements = tree[level_idx].first;
	auto &cascades = tree[level_idx].second;
	const auto &child_level = tree[level_idx - 1];
	const auto count = elements.size();

	idx_t child_run_length = 1;
	auto run_length = child_run_length * fanout;
	for (idx_t l = 1; l < level_idx; ++l) {
		child_run_length = run_length;
		run_length *= fanout;
	}

	const RunElement SENTINEL(MergeSortTraits<ElementType>::SENTINEL(), MergeSortTraits<idx_t>::SENTINEL());

	//	Position markers for scanning the children.
	using Bounds = pair<OffsetType, OffsetType>;
	array<Bounds, fanout> bounds;
	//	Start with first element of each (sorted) child run
	RunElements players;
	const auto child_base = run_idx * run_length;
	for (idx_t child_run = 0; child_run < fanout; ++child_run) {
		const auto child_idx = child_base + child_run * child_run_length;
		bounds[child_run] = {OffsetType(MinValue<idx_t>(child_idx, count)),
		                     OffsetType(MinValue<idx_t>(child_idx + child_run_length, count))};
		if (bounds[child_run].first != bounds[child_run].second) {
			players[child_run] = {child_level.first[child_idx], child_run};
		} else {
			//	Empty child
			players[child_run] = SENTINEL;
		}
	}

	//	Play the first round and extract the winner
	Games games;
	auto element_idx = child_base;
	auto cascade_idx = fanout * run_idx * (run_length / cascading + 2);
	auto winner = StartGames(games, players, SENTINEL);
	while (winner != SENTINEL) {
		// Add fractional cascading pointers
		// if we are on a fraction boundary
		if (!cascades.empty() && element_idx % cascading == 0) {
			for (idx_t i = 0; i < fanout; ++i) {
				cascades[cascade_idx++] = bounds[i].first;
			}
		}

		//	Insert new winner element into the current run
		elements[element_idx++] = winner.first;
		const auto child_run = winner.second;
		auto &child_idx = bounds[child_run].first;
		++child_idx;

		//	Move to the next entry in the child run (if any)
		if (child_idx < bounds[child_run].second) {
			winner = ReplayGames(games, child_run, {child_level.first[child_idx], child_run});
		} else {
			winner = ReplayGames(games, child_run, SENTINEL);
		}
	}

	// Add terminal cascade pointers to the end
	if (!cascades.empty()) {
		for (idx_t j = 0; j < 2; ++j) {
			for (idx_t i = 0; i < fanout; ++i) {
				cascades[cascade_idx++] = bounds[i].first;
			}
		}
	}

	++build_complete;
}